

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall PKCS12Test_TestWindows_Test::TestBody(PKCS12Test_TestWindows_Test *this)

{
  undefined1 auVar1 [16];
  Span<const_unsigned_char> der;
  string_view s;
  undefined1 local_30 [8];
  string data;
  PKCS12Test_TestWindows_Test *this_local;
  
  data.field_2._8_8_ = this;
  GetTestData_abi_cxx11_((string *)local_30,"crypto/pkcs8/test/windows.p12");
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s._M_str = auVar1._8_8_;
  s._M_len = (size_t)s._M_str;
  der = bssl::StringAsBytes(auVar1._0_8_,s);
  TestImpl("Windows",der,"foo",(char *)0x0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(PKCS12Test, TestWindows) {
  // windows.p12 is a dummy key and certificate exported from the certificate
  // manager on Windows 7. It has a friendlyName, but only on the key, where we
  // ignore it, and not the certificate.
  std::string data = GetTestData("crypto/pkcs8/test/windows.p12");
  TestImpl("Windows", bssl::StringAsBytes(data), kPassword, nullptr);
}